

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

Status cmSystemTools::CreateLink(string *origName,string *newName)

{
  Status status;
  Status local_58;
  string local_50;
  string local_30;
  
  local_58 = CreateLinkQuietly(origName,newName);
  if (local_58.Kind_ != Success) {
    cmsys::Status::GetString_abi_cxx11_(&local_30,&local_58);
    cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string>
              (&local_50,(char (*) [24])"failed to create link \'",newName,(char (*) [4])0x74ed8b,
               &local_30);
    Error(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return local_58;
}

Assistant:

cmsys::Status cmSystemTools::CreateLink(std::string const& origName,
                                        std::string const& newName)
{
  cmsys::Status status = cmSystemTools::CreateLinkQuietly(origName, newName);
  if (!status) {
    cmSystemTools::Error(
      cmStrCat("failed to create link '", newName, "': ", status.GetString()));
  }
  return status;
}